

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O2

void __thiscall
ST::string::to_buffer(string *this,char_buffer *result,bool utf8,bool substitute_out_of_range)

{
  undefined7 in_register_00000011;
  char_buffer local_30;
  
  if ((int)CONCAT71(in_register_00000011,utf8) == 0) {
    to_latin_1(&local_30,this,substitute_out_of_range);
  }
  else {
    to_utf8(&local_30,this);
  }
  buffer<char>::operator=(result,&local_30);
  buffer<char>::~buffer(&local_30);
  return;
}

Assistant:

void to_buffer(char_buffer &result, bool utf8 = true,
                       bool substitute_out_of_range = true) const
        {
            if (utf8)
                result = to_utf8();
            else
                result = to_latin_1(substitute_out_of_range);
        }